

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgba_hex(char *rgb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *local_20;
  char *c;
  char *rgb_local;
  nk_color col;
  
  local_20 = rgb;
  if (*rgb == '#') {
    local_20 = rgb + 1;
  }
  iVar1 = nk_parse_hex(local_20,2);
  iVar2 = nk_parse_hex(local_20 + 2,2);
  iVar3 = nk_parse_hex(local_20 + 4,2);
  iVar4 = nk_parse_hex(local_20 + 6,2);
  rgb_local._4_4_ =
       (nk_color)CONCAT13((nk_byte)iVar4,CONCAT12((char)iVar3,CONCAT11((char)iVar2,(char)iVar1)));
  return rgb_local._4_4_;
}

Assistant:

NK_API struct nk_color
nk_rgba_hex(const char *rgb)
{
    struct nk_color col;
    const char *c = rgb;
    if (*c == '#') c++;
    col.r = (nk_byte)nk_parse_hex(c, 2);
    col.g = (nk_byte)nk_parse_hex(c+2, 2);
    col.b = (nk_byte)nk_parse_hex(c+4, 2);
    col.a = (nk_byte)nk_parse_hex(c+6, 2);
    return col;
}